

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

void event_track::write_vtt_track_cmaf_header(uint32_t track_id,uint32_t timescale,ostream *ot)

{
  uint uVar1;
  allocator<char> local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sparse_moov;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,webvtt::base_64_moov,&local_51);
  base64_decode(&sparse_moov,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  fmp4_stream::set_track_id(&sparse_moov,track_id);
  uVar1 = timescale >> 0x18 | (timescale & 0xff0000) >> 8 | (timescale & 0xff00) << 8 |
          timescale << 0x18;
  *(uint *)(sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x1c) = uVar1;
  *(uint *)(sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0xf4) = uVar1;
  if (*(int *)(ot + *(long *)(*(long *)ot + -0x18) + 0x20) == 0) {
    std::ostream::write((char *)ot,0x114af0);
    std::ostream::write((char *)ot,
                        (long)sparse_moov.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void event_track::write_vtt_track_cmaf_header(uint32_t track_id, uint32_t timescale, std::ostream& ot)
{
	std::vector<uint8_t> sparse_moov = base64_decode(webvtt::base_64_moov);
	
	set_track_id(sparse_moov, track_id);
	
	// write back the timescale mvhd / mhd
	fmp4_write_uint32(timescale, (char*)&sparse_moov[28]);
	fmp4_write_uint32(timescale, (char*)&sparse_moov[244]);

	if (ot.good())
	{
		// write the ftyp header  
		ot.write((char*)&sparse_ftyp_vtt[0], 20);
		ot.write((const char*)&sparse_moov[0], sparse_moov.size());
	}

	return;
}